

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
* __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
::child(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
        *this,size_type i)

{
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, Off..." /* TRUNCATED STRING LITERAL */
                 );
  }
  if (this[0xb] ==
      (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
       )0x0) {
    return *(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
             **)(this + i * 8 + 0x100);
  }
  __assert_fail("N < 3 || !leaf()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x482,
                "const typename layout_type::template ElementType<N> *phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::GetField() const [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>, N = 3UL]"
               );
}

Assistant:

btree_node *child(size_type i) const { return GetField<3>()[i]; }